

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool copyFileIfNewer(QString *sourceFileName,QString *destinationFileName,Options *options,
                    bool forceOverwrite)

{
  FILE *pFVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  QFileInfo destinationFileInfo;
  QFileInfo sourceFileInfo;
  QArrayData *local_80 [3];
  QArrayData *local_68;
  undefined8 *puStack_60;
  undefined8 local_58;
  QDateTime local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&dependenciesForDepfile,dependenciesForDepfile.d.size,
             sourceFileName);
  QList<QString>::end(&dependenciesForDepfile);
  cVar2 = QFile::exists((QString *)destinationFileName);
  if (cVar2 != '\0') {
    local_80[0] = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)local_80,(QString *)destinationFileName);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_40,(QString *)sourceFileName);
    if (forceOverwrite) {
LAB_0010e564:
      QFile::QFile((QFile *)&local_68,(QString *)destinationFileName);
      bVar4 = QFile::remove();
      QFile::~QFile((QFile *)&local_68);
      if (bVar4 == 0) {
        copyFileIfNewer();
        bVar4 = 0;
        goto LAB_0010e7a5;
      }
      bVar3 = true;
    }
    else {
      QFileInfo::fileTime((FileTime)(QDateTime *)&local_68);
      QFileInfo::fileTime((FileTime)local_48);
      cVar2 = compareThreeWay((QDateTime *)&local_68,local_48);
      if ('\0' < cVar2) {
        QDateTime::~QDateTime(local_48);
        QDateTime::~QDateTime((QDateTime *)&local_68);
        goto LAB_0010e564;
      }
      bVar3 = alwaysOverwritableFile(destinationFileName);
      QDateTime::~QDateTime(local_48);
      QDateTime::~QDateTime((QDateTime *)&local_68);
      pFVar1 = _stdout;
      if (bVar3) goto LAB_0010e564;
      bVar4 = 1;
      if (options->verbose == true) {
        QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(sourceFileName->d).ptr);
        puVar5 = puStack_60;
        if (puStack_60 == (undefined8 *)0x0) {
          puVar5 = &QByteArray::_empty;
        }
        fprintf(pFVar1,"  -- Skipping file %s. Same or newer file already in place.\n",puVar5);
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,1,0x10);
          }
        }
      }
LAB_0010e7a5:
      bVar3 = false;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_40);
    QFileInfo::~QFileInfo((QFileInfo *)local_80);
    if (!bVar3) goto LAB_0010e6f6;
  }
  local_68 = (QArrayData *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_58 = 0;
  QDir::QDir((QDir *)&local_40,(QString *)&local_68);
  QFileInfo::QFileInfo((QFileInfo *)local_48,(QString *)destinationFileName);
  QFileInfo::path();
  cVar2 = QDir::mkpath((QDir *)&local_40,local_80,0);
  if (local_80[0] != (QArrayData *)0x0) {
    LOCK();
    (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80[0],2,0x10);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)local_48);
  QDir::~QDir((QDir *)&local_40);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (cVar2 == '\0') {
    copyFileIfNewer();
LAB_0010e7b8:
    bVar4 = 0;
  }
  else {
    cVar2 = QFile::exists((QString *)destinationFileName);
    if (cVar2 == '\0') {
      cVar2 = QFile::copy((QString *)sourceFileName,(QString *)destinationFileName);
      if (cVar2 == '\0') {
        copyFileIfNewer();
        goto LAB_0010e7b8;
      }
    }
    pFVar1 = _stdout;
    bVar4 = 1;
    if (options->verbose == true) {
      QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(destinationFileName->d).ptr);
      puVar5 = puStack_60;
      if (puStack_60 == (undefined8 *)0x0) {
        puVar5 = &QByteArray::_empty;
      }
      fprintf(pFVar1,"  -- Copied %s\n",puVar5);
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,1,0x10);
        }
      }
      fflush(_stdout);
    }
  }
LAB_0010e6f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool copyFileIfNewer(const QString &sourceFileName,
                     const QString &destinationFileName,
                     const Options &options,
                     bool forceOverwrite = false)
{
    dependenciesForDepfile << sourceFileName;
    if (QFile::exists(destinationFileName)) {
        QFileInfo destinationFileInfo(destinationFileName);
        QFileInfo sourceFileInfo(sourceFileName);

        if (!forceOverwrite
                && sourceFileInfo.lastModified() <= destinationFileInfo.lastModified()
                && !alwaysOverwritableFile(destinationFileName)) {
            if (options.verbose)
                fprintf(stdout, "  -- Skipping file %s. Same or newer file already in place.\n", qPrintable(sourceFileName));
            return true;
        } else {
            if (!QFile(destinationFileName).remove()) {
                fprintf(stderr, "Can't remove old file: %s\n", qPrintable(destinationFileName));
                return false;
            }
        }
    }

    if (!QDir().mkpath(QFileInfo(destinationFileName).path())) {
        fprintf(stderr, "Cannot make output directory for %s.\n", qPrintable(destinationFileName));
        return false;
    }

    if (!QFile::exists(destinationFileName) && !QFile::copy(sourceFileName, destinationFileName)) {
        fprintf(stderr, "Failed to copy %s to %s.\n", qPrintable(sourceFileName), qPrintable(destinationFileName));
        return false;
    } else if (options.verbose) {
        fprintf(stdout, "  -- Copied %s\n", qPrintable(destinationFileName));
        fflush(stdout);
    }
    return true;
}